

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O0

MPP_RET __thiscall Mpp::get_packet_async(Mpp *this,MppPacket *packet)

{
  RK_S32 RVar1;
  Mutex *pMVar2;
  undefined1 local_60 [8];
  AutoMutex autoFrameLock;
  RK_U32 offset;
  MppPacketImpl *impl;
  MppPacket pkt;
  undefined1 local_30 [4];
  RK_S32 ret;
  AutoMutex autoPacketLock;
  MppPacket *packet_local;
  Mpp *this_local;
  
  autoPacketLock.mLock = (Mutex *)packet;
  pMVar2 = MppMutexCond::mutex(&this->mPktOut->super_MppMutexCond);
  Mutex::Autolock::Autolock((Autolock *)local_30,pMVar2,1);
  ((autoPacketLock.mLock)->mMutex).__align = 0;
  RVar1 = mpp_list::list_size(this->mPktOut);
  if (RVar1 == 0) {
    if (this->mOutputTimeout == MPP_POLL_NON_BLOCK) {
      usleep(1000);
    }
    else if (this->mOutputTimeout < MPP_POLL_NON_BLOCK) {
      MppMutexCond::wait(&this->mPktOut->super_MppMutexCond,pMVar2);
    }
    else {
      pkt._4_4_ = MppMutexCond::wait(&this->mPktOut->super_MppMutexCond,
                                     (void *)(long)this->mOutputTimeout);
      if (pkt._4_4_ != 0) {
        if (pkt._4_4_ == 0x6e) {
          this_local._4_4_ = MPP_ERR_TIMEOUT;
          pkt._0_4_ = 1;
        }
        else {
          this_local._4_4_ = MPP_NOK;
          pkt._0_4_ = 1;
        }
        goto LAB_0013b311;
      }
    }
  }
  RVar1 = mpp_list::list_size(this->mPktOut);
  if (RVar1 == 0) {
    pMVar2 = MppMutexCond::mutex(&this->mFrmIn->super_MppMutexCond);
    Mutex::Autolock::Autolock((Autolock *)local_60,pMVar2,1);
    RVar1 = mpp_list::list_size(this->mFrmIn);
    if (RVar1 != 0) {
      notify(this,1);
    }
    this_local._4_4_ = MPP_NOK;
    pkt._0_4_ = 1;
    Mutex::Autolock::~Autolock((Autolock *)local_60);
  }
  else {
    impl = (MppPacketImpl *)0x0;
    mpp_list::del_at_head(this->mPktOut,&impl,8);
    this->mPacketGetCount = this->mPacketGetCount + 1;
    notify(this,2);
    ((autoPacketLock.mLock)->mMutex).__align = (long)impl;
    autoFrameLock.mLock._4_4_ = (int)impl->pos - (int)impl->data;
    mpp_buffer_sync_partial_begin_f
              (impl->buffer,1,autoFrameLock.mLock._4_4_,(RK_U32)impl->length,"get_packet_async");
    this_local._4_4_ = MPP_OK;
    pkt._0_4_ = 1;
  }
LAB_0013b311:
  Mutex::Autolock::~Autolock((Autolock *)local_30);
  return this_local._4_4_;
}

Assistant:

MPP_RET Mpp::get_packet_async(MppPacket *packet)
{
    AutoMutex autoPacketLock(mPktOut->mutex());

    *packet = NULL;
    if (0 == mPktOut->list_size()) {
        if (mOutputTimeout) {
            if (mOutputTimeout < 0) {
                /* block wait */
                mPktOut->wait();
            } else {
                RK_S32 ret = mPktOut->wait(mOutputTimeout);
                if (ret) {
                    if (ret == ETIMEDOUT)
                        return MPP_ERR_TIMEOUT;
                    else
                        return MPP_NOK;
                }
            }
        } else {
            /* NOTE: in non-block mode the sleep is to avoid user's dead loop */
            msleep(1);
        }
    }

    if (mPktOut->list_size()) {
        MppPacket pkt = NULL;
        MppPacketImpl *impl = NULL;
        RK_U32 offset;

        mPktOut->del_at_head(&pkt, sizeof(pkt));
        mPacketGetCount++;
        notify(MPP_OUTPUT_DEQUEUE);

        *packet = pkt;

        impl = (MppPacketImpl *)pkt;
        offset = (RK_U32)((char *)impl->pos - (char *)impl->data);
        mpp_buffer_sync_ro_partial_begin(impl->buffer, offset, impl->length);
    } else {
        AutoMutex autoFrameLock(mFrmIn->mutex());

        if (mFrmIn->list_size())
            notify(MPP_INPUT_ENQUEUE);

        return MPP_NOK;
    }

    return MPP_OK;
}